

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O0

void xmlSchemaContentModelDump(xmlSchemaParticlePtr particle,FILE *output,int depth)

{
  FILE *__stream;
  xmlChar *pxVar1;
  int local_9c;
  undefined1 local_98 [4];
  int i;
  char shift [100];
  xmlSchemaTreeItemPtr_conflict term;
  xmlChar *str;
  FILE *pFStack_18;
  int depth_local;
  FILE *output_local;
  xmlSchemaParticlePtr particle_local;
  
  term = (xmlSchemaTreeItemPtr_conflict)0x0;
  if (particle != (xmlSchemaParticlePtr)0x0) {
    str._4_4_ = depth;
    pFStack_18 = (FILE *)output;
    output_local = (FILE *)particle;
    for (local_9c = 0; local_9c < str._4_4_ && local_9c < 0x19; local_9c = local_9c + 1) {
      local_98[local_9c * 2 + 1] = 0x20;
      local_98[local_9c << 1] = 0x20;
    }
    local_98[local_9c * 2 + 1] = 0;
    local_98[local_9c << 1] = 0;
    fprintf(pFStack_18,"%s",local_98);
    __stream = pFStack_18;
    if (output_local->_IO_read_base == (char *)0x0) {
      fprintf(pFStack_18,"MISSING particle term\n");
    }
    else {
      unique0x00012000 = (int *)output_local->_IO_read_base;
      if (unique0x00012000 == (int *)0x0) {
        fprintf(pFStack_18,"(NULL)");
      }
      else {
        switch(*unique0x00012000) {
        case 2:
          fprintf(pFStack_18,"ANY");
          break;
        default:
          fprintf(pFStack_18,"UNKNOWN\n");
          return;
        case 6:
          fprintf(pFStack_18,"SEQUENCE");
          break;
        case 7:
          fprintf(pFStack_18,"CHOICE");
          break;
        case 8:
          fprintf(pFStack_18,"ALL");
          break;
        case 0xe:
          pxVar1 = xmlSchemaFormatQName
                             ((xmlChar **)&term,*(xmlChar **)(unique0x00012000 + 0x18),
                              *(xmlChar **)(unique0x00012000 + 4));
          fprintf(__stream,"ELEM \'%s\'",pxVar1);
          if (term != (xmlSchemaTreeItemPtr_conflict)0x0) {
            (*xmlFree)(term);
            term = (xmlSchemaTreeItemPtr_conflict)0x0;
          }
        }
      }
      if (*(int *)&output_local->_IO_write_base != 1) {
        fprintf(pFStack_18," min: %d",(ulong)*(uint *)&output_local->_IO_write_base);
      }
      if (*(int *)((long)&output_local->_IO_write_base + 4) < 0x40000000) {
        if (*(int *)((long)&output_local->_IO_write_base + 4) != 1) {
          fprintf(pFStack_18," max: %d",(ulong)*(uint *)((long)&output_local->_IO_write_base + 4));
        }
      }
      else {
        fprintf(pFStack_18," max: unbounded");
      }
      fprintf(pFStack_18,"\n");
      if (((stack0xffffffffffffffd0 != (int *)0x0) &&
          (((*stack0xffffffffffffffd0 == 6 || (*stack0xffffffffffffffd0 == 7)) ||
           (*stack0xffffffffffffffd0 == 8)))) && (*(long *)(stack0xffffffffffffffd0 + 6) != 0)) {
        xmlSchemaContentModelDump
                  (*(xmlSchemaParticlePtr *)(stack0xffffffffffffffd0 + 6),(FILE *)pFStack_18,
                   str._4_4_ + 1);
      }
      if (output_local->_IO_read_end != (char *)0x0) {
        xmlSchemaContentModelDump
                  ((xmlSchemaParticlePtr)output_local->_IO_read_end,(FILE *)pFStack_18,str._4_4_);
      }
    }
  }
  return;
}

Assistant:

static void
xmlSchemaContentModelDump(xmlSchemaParticlePtr particle, FILE * output, int depth)
{
    xmlChar *str = NULL;
    xmlSchemaTreeItemPtr term;
    char shift[100];
    int i;

    if (particle == NULL)
	return;
    for (i = 0;((i < depth) && (i < 25));i++)
        shift[2 * i] = shift[2 * i + 1] = ' ';
    shift[2 * i] = shift[2 * i + 1] = 0;
    fprintf(output, "%s", shift);
    if (particle->children == NULL) {
	fprintf(output, "MISSING particle term\n");
	return;
    }
    term = particle->children;
    if (term == NULL) {
	fprintf(output, "(NULL)");
    } else {
	switch (term->type) {
	    case XML_SCHEMA_TYPE_ELEMENT:
		fprintf(output, "ELEM '%s'", xmlSchemaFormatQName(&str,
		    ((xmlSchemaElementPtr)term)->targetNamespace,
		    ((xmlSchemaElementPtr)term)->name));
		FREE_AND_NULL(str);
		break;
	    case XML_SCHEMA_TYPE_SEQUENCE:
		fprintf(output, "SEQUENCE");
		break;
	    case XML_SCHEMA_TYPE_CHOICE:
		fprintf(output, "CHOICE");
		break;
	    case XML_SCHEMA_TYPE_ALL:
		fprintf(output, "ALL");
		break;
	    case XML_SCHEMA_TYPE_ANY:
		fprintf(output, "ANY");
		break;
	    default:
		fprintf(output, "UNKNOWN\n");
		return;
	}
    }
    if (particle->minOccurs != 1)
	fprintf(output, " min: %d", particle->minOccurs);
    if (particle->maxOccurs >= UNBOUNDED)
	fprintf(output, " max: unbounded");
    else if (particle->maxOccurs != 1)
	fprintf(output, " max: %d", particle->maxOccurs);
    fprintf(output, "\n");
    if (term &&
	((term->type == XML_SCHEMA_TYPE_SEQUENCE) ||
	 (term->type == XML_SCHEMA_TYPE_CHOICE) ||
	 (term->type == XML_SCHEMA_TYPE_ALL)) &&
	 (term->children != NULL)) {
	xmlSchemaContentModelDump((xmlSchemaParticlePtr) term->children,
	    output, depth +1);
    }
    if (particle->next != NULL)
	xmlSchemaContentModelDump((xmlSchemaParticlePtr) particle->next,
		output, depth);
}